

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::OperatorResolver::visit(OperatorResolver *this,InPlaceOperator *o)

{
  pool_ref<soul::AST::Expression> *e;
  pool_ref<soul::AST::Expression> *e_00;
  size_t *psVar1;
  Context *this_00;
  void **this_01;
  Op OVar2;
  int iVar3;
  PoolItem *pPVar4;
  TypeCast *args_2;
  char **in_R9;
  Type destType;
  Type sourceType;
  BinaryOperatorTypes opTypes;
  Category in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb1;
  StructurePtr local_140;
  Type local_138;
  pool_ref<soul::AST::Expression> *local_120;
  char *local_118;
  BinaryOperatorTypes local_110;
  string local_e0;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  e = &o->target;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  e_00 = &o->source;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e_00);
  iVar3 = (*(o->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(o);
  if ((char)iVar3 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    iVar3 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
    if ((char)iVar3 == '\0') {
      local_110.resultType._0_8_ = BinaryOp::getSymbol(o->operation);
      CompileMessageHelpers::createMessage<char_const*>
                (&local_68,(CompileMessageHelpers *)0x1,none,0x27cd42,(char *)&local_110,in_R9);
      AST::Context::throwError
                (&(o->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
    }
    SanityCheckPass::throwErrorIfNotReadableValue(e_00->object);
    (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[4])(&stack0xfffffffffffffeb0);
    (*(e_00->object->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_138);
    OVar2 = o->operation;
    if ((OVar2 & ~subtract) == logicalOr) {
      TypeRules::getTypesForLogicalOp(&local_110,(Type *)&stack0xfffffffffffffeb0,&local_138);
    }
    else if ((OVar2 < unknown) && ((0x700e0U >> (OVar2 & (leftShift|greaterThanOrEqual)) & 1) != 0))
    {
      TypeRules::getTypesForBitwiseOp(&local_110,(Type *)&stack0xfffffffffffffeb0,&local_138);
    }
    else if ((OVar2 & ~subtract) == equals) {
      TypeRules::getTypesForEqualityOp(&local_110,(Type *)&stack0xfffffffffffffeb0,&local_138);
    }
    else if ((OVar2 & ~divide) == lessThan) {
      TypeRules::getTypesForComparisonOp(&local_110,(Type *)&stack0xfffffffffffffeb0,&local_138);
    }
    else {
      if (modulo < OVar2) {
        throwInternalCompilerError("getTypes",0xc3);
      }
      TypeRules::getTypesForArithmeticOp
                (&local_110,(Type *)&stack0xfffffffffffffeb0,&local_138,false);
    }
    this_00 = &(o->super_Expression).super_Statement.super_ASTObject.context;
    if (local_110.resultType.category == invalid) {
      local_118 = BinaryOp::getSymbol(o->operation);
      Type::getDescription_abi_cxx11_(&local_e0,&local_138);
      Type::getDescription_abi_cxx11_(&local_c0,(Type *)&stack0xfffffffffffffeb0);
      CompileMessageHelpers::createMessage<char_const*,std::__cxx11::string,std::__cxx11::string>
                (&local_a0,(CompileMessageHelpers *)0x1,none,0x27cabb,(char *)&local_118,
                 (char **)&local_e0,&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_stack_fffffffffffffeb1,in_stack_fffffffffffffeb0));
      AST::Context::throwError(this_00,&local_a0,false);
    }
    local_120 = e;
    SanityCheckPass::expectSilentCastPossible(this_00,(Type *)((long)&local_110 + 0x18U),e->object);
    SanityCheckPass::expectSilentCastPossible
              (this_00,(Type *)((long)&local_110 + 0x18U),e_00->object);
    pPVar4 = PoolAllocator::allocateSpaceForObject
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,0x78);
    this_01 = &pPVar4->item;
    AST::BinaryOperator::BinaryOperator
              ((BinaryOperator *)this_01,this_00,(o->target).object,(o->source).object,o->operation)
    ;
    pPVar4->destructor =
         PoolAllocator::
         allocate<soul::AST::BinaryOperator,_soul::AST::Context_&,_soul::pool_ref<soul::AST::Expression>_&,_soul::pool_ref<soul::AST::Expression>_&,_soul::BinaryOp::Op_&>
         ::anon_class_1_0_00000001::__invoke;
    if ((((in_stack_fffffffffffffeb0 & ~primitive) == wrap) &&
        (local_138.primitiveType.type - int32 < 2)) && (o->operation < multiply)) {
      args_2 = PoolAllocator::
               allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type&,soul::AST::BinaryOperator&>
                         (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                          &(e_00->object->super_Statement).super_ASTObject.context,
                          (Type *)&stack0xfffffffffffffeb0,(BinaryOperator *)this_01);
      o = (InPlaceOperator *)
          PoolAllocator::
          allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::TypeCast&>
                    (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,this_00,
                     local_120,args_2);
    }
    else {
      o = (InPlaceOperator *)
          PoolAllocator::
          allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::BinaryOperator&>
                    (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,this_00,
                     local_120,(BinaryOperator *)this_01);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_110.operandType.structure.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_110.resultType.structure.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_138.structure.object);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_140.object);
  }
  return &o->super_Expression;
}

Assistant:

AST::Expression& visit (AST::InPlaceOperator& o) override
        {
            super::visit (o);

            if (! o.isResolved())
            {
                ++numFails;
                return o;
            }

            if (! o.target->isAssignable())
                o.context.throwError (Errors::operatorNeedsAssignableTarget (BinaryOp::getSymbol (o.operation)));

            SanityCheckPass::throwErrorIfNotReadableValue (o.source);

            auto destType    = o.target->getResultType();
            auto sourceType  = o.source->getResultType();

            auto opTypes = BinaryOp::getTypes (o.operation, destType, sourceType);

            if (! opTypes.resultType.isValid())
                o.context.throwError (Errors::illegalTypesForBinaryOperator (BinaryOp::getSymbol (o.operation),
                                                                             sourceType.getDescription(),
                                                                             destType.getDescription()));

            SanityCheckPass::expectSilentCastPossible (o.context, opTypes.operandType, o.target);
            SanityCheckPass::expectSilentCastPossible (o.context, opTypes.operandType, o.source);

            auto& binaryOp = allocator.allocate<AST::BinaryOperator> (o.context, o.target, o.source, o.operation);

            // special-case handling for addition of an int to a wrap or clamp type, as we want this to
            // work without the user needing to write it out long-hand with a cast
            if (destType.isBoundedInt() && sourceType.isInteger()
                 && (o.operation == BinaryOp::Op::add || o.operation == BinaryOp::Op::subtract))
            {
                auto& resultCast = allocator.allocate<AST::TypeCast> (o.source->context, destType, binaryOp);
                return allocator.allocate<AST::Assignment> (o.context, o.target, resultCast);
            }

            return allocator.allocate<AST::Assignment> (o.context, o.target, binaryOp);
        }